

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O1

void __thiscall
BackwardPass::ProcessArrayRegOpndUse(BackwardPass *this,Instr *instr,ArrayRegOpnd *arrayRegOpnd)

{
  code *pcVar1;
  BasicBlock *pBVar2;
  BackwardPass *pBVar3;
  bool bVar4;
  bool bVar5;
  OpndKind OVar6;
  BOOLEAN BVar7;
  ObjectType OVar8;
  ObjectType OVar9;
  undefined4 *puVar10;
  StackSym *pSVar11;
  anon_union_2_4_ea848c7b_for_ValueType_13 *paVar12;
  RegOpnd *pRVar13;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  ulong uVar14;
  Instr *this_00;
  IndirOpnd *pIVar15;
  Opnd *pOVar16;
  byte bVar17;
  uint uVar18;
  anon_union_2_4_ea848c7b_for_ValueType_13 *paVar19;
  BVSparse<Memory::JitArenaAllocator> *this_01;
  Opnd *checkedSrc_1;
  long lVar20;
  anon_union_2_4_ea848c7b_for_ValueType_13 *this_02;
  Opnd *checkedSrc;
  RegOpnd *local_a0;
  Opnd *local_98 [2];
  BasicBlock *local_88;
  anon_union_2_4_ea848c7b_for_ValueType_13 *local_80;
  BackwardPass *local_78;
  anon_union_2_4_ea848c7b_for_ValueType_13 *local_70;
  anon_union_2_4_ea848c7b_for_ValueType_13 *local_68;
  anon_union_2_4_ea848c7b_for_ValueType_13 *local_60;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_52;
  undefined4 *local_50;
  ArrayRegOpnd *local_48;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_3a;
  char cStack_38;
  undefined4 uStack_34;
  ValueType arrayValueType;
  
  if (this->tag != DeadStorePhase) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1230,"(tag == Js::DeadStorePhase)","tag == Js::DeadStorePhase");
    if (!bVar4) goto LAB_003e87dc;
    *puVar10 = 0;
  }
  if (this->isCollectionPass == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1231,"(!IsCollectionPass())","!IsCollectionPass()");
    if (!bVar4) goto LAB_003e87dc;
    *puVar10 = 0;
  }
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1232,"(instr)","instr");
    if (!bVar4) goto LAB_003e87dc;
    *puVar10 = 0;
  }
  if (arrayRegOpnd == (ArrayRegOpnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1233,"(arrayRegOpnd)","arrayRegOpnd");
    if (!bVar4) goto LAB_003e87dc;
    *puVar10 = 0;
  }
  if (((arrayRegOpnd->headSegmentSym == (StackSym *)0x0) &&
      (arrayRegOpnd->headSegmentLengthSym == (StackSym *)0x0)) &&
     (pSVar11 = IR::ArrayRegOpnd::LengthSym(arrayRegOpnd), pSVar11 == (StackSym *)0x0)) {
    return;
  }
  local_3a = (arrayRegOpnd->super_RegOpnd).super_Opnd.m_valueType.field_0;
  paVar12 = &local_3a;
  bVar4 = ValueType::IsLikelyTypedArray((ValueType *)&paVar12->field_0);
  bVar5 = ValueType::IsArrayOrObjectWithArray((ValueType *)&paVar12->field_0);
  local_50 = (undefined4 *)CONCAT71(local_50._1_7_,bVar4);
  if (bVar4 == bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    paVar12 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)__tls_get_addr(&PTR_0155fe48);
    *(undefined4 *)paVar12 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x123c,"(isJsArray == arrayValueType.IsArrayOrObjectWithArray())",
                       "isJsArray == arrayValueType.IsArrayOrObjectWithArray()");
    if (!bVar4) goto LAB_003e87dc;
    *(undefined4 *)paVar12 = 0;
  }
  bVar4 = ValueType::IsOptimizedTypedArray((ValueType *)&local_3a.field_0);
  if ((bool)(byte)local_50 != bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    paVar12 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)__tls_get_addr(&PTR_0155fe48);
    *(undefined4 *)paVar12 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x123d,"(!isJsArray == arrayValueType.IsOptimizedTypedArray())",
                       "!isJsArray == arrayValueType.IsOptimizedTypedArray()");
    if (!bVar4) goto LAB_003e87dc;
    *(undefined4 *)paVar12 = 0;
  }
  local_88 = this->currentBlock;
  local_60 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)instr;
  local_48 = arrayRegOpnd;
  if (((this->currentPrePassLoop == (Loop *)0x0) &&
      ((pSVar11 = arrayRegOpnd->headSegmentSym, pSVar11 != (StackSym *)0x0 ||
       (arrayRegOpnd->headSegmentLengthSym != (StackSym *)0x0)))) &&
     (((byte)local_50 != '\0' || (instr->m_opcode != NoImplicitCallUses)))) {
    local_68 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)((ulong)local_68 & 0xffffffff00000000);
    if ((pSVar11 != (StackSym *)0x0) && ((*(ushort *)&instr->field_0x36 & 0x400) != 0)) {
      BVar7 = BVSparse<Memory::JitArenaAllocator>::Test
                        (local_88->upwardExposedUses,(pSVar11->super_Sym).m_id);
      local_68 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)
                 CONCAT44(local_68._4_4_,(int)CONCAT71(extraout_var,BVar7 == '\0'));
    }
    if (((instr->field_0x37 & 8) == 0) || (arrayRegOpnd->headSegmentLengthSym == (StackSym *)0x0)) {
      uVar14 = 0;
    }
    else {
      BVar7 = BVSparse<Memory::JitArenaAllocator>::Test
                        (local_88->upwardExposedUses,
                         (arrayRegOpnd->headSegmentLengthSym->super_Sym).m_id);
      uVar14 = CONCAT71(extraout_var_00,BVar7 == '\0');
      if ((BVar7 == '\0') && ((instr->field_0x37 & 0x10) != 0)) {
        _cStack_38 = (Opnd *)CONCAT44(uStack_34,(int)uVar14);
        paVar12 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)
                  GlobOpt::FindUpperBoundsCheckInstr(this->globOpt,instr);
        if (paVar12 == (anon_union_2_4_ea848c7b_for_ValueType_13 *)0x0 ||
            paVar12 == (anon_union_2_4_ea848c7b_for_ValueType_13 *)instr) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar10 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x1250,"(upperBoundCheck && upperBoundCheck != instr)",
                             "upperBoundCheck && upperBoundCheck != instr");
          if (!bVar4) goto LAB_003e87dc;
          *puVar10 = 0;
          arrayRegOpnd = local_48;
        }
        pRVar13 = IR::Opnd::AsRegOpnd(*(Opnd **)(paVar12 + 0x28));
        if (pRVar13->m_sym != arrayRegOpnd->headSegmentLengthSym) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar10 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x1251,
                             "(upperBoundCheck->GetSrc2()->AsRegOpnd()->m_sym == arrayRegOpnd->HeadSegmentLengthSym())"
                             ,
                             "upperBoundCheck->GetSrc2()->AsRegOpnd()->m_sym == arrayRegOpnd->HeadSegmentLengthSym()"
                            );
          if (!bVar4) goto LAB_003e87dc;
          *puVar10 = 0;
        }
        this_00 = GlobOpt::FindArraySegmentLoadInstr(this->globOpt,(Instr *)&paVar12->field_0);
        pRVar13 = IR::Opnd::AsRegOpnd(this_00->m_dst);
        if (pRVar13->m_sym != local_48->headSegmentLengthSym) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar10 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x1256,
                             "(headSegmentLengthLoad->GetDst()->AsRegOpnd()->m_sym == arrayRegOpnd->HeadSegmentLengthSym())"
                             ,
                             "headSegmentLengthLoad->GetDst()->AsRegOpnd()->m_sym == arrayRegOpnd->HeadSegmentLengthSym()"
                            );
          if (!bVar4) goto LAB_003e87dc;
          *puVar10 = 0;
        }
        pIVar15 = IR::Opnd::AsIndirOpnd(this_00->m_src1);
        if (pIVar15->m_baseOpnd->m_sym !=
            (&(local_48->super_RegOpnd).m_sym)[(ulong)((byte)local_50 ^ 1) * 2]) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar10 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x1259,
                             "(headSegmentLengthLoad->GetSrc1()->AsIndirOpnd()->GetBaseOpnd()->m_sym == (isJsArray ? arrayRegOpnd->HeadSegmentSym() : arrayRegOpnd->m_sym))"
                             ,
                             "headSegmentLengthLoad->GetSrc1()->AsIndirOpnd()->GetBaseOpnd()->m_sym == (isJsArray ? arrayRegOpnd->HeadSegmentSym() : arrayRegOpnd->m_sym)"
                            );
          if (!bVar4) goto LAB_003e87dc;
          *puVar10 = 0;
        }
        pOVar16 = IR::Instr::UnlinkSrc1(this_00);
        IR::Instr::ReplaceSrc2((Instr *)&paVar12->field_0,pOVar16);
        this_00->m_opcode = Nop;
        uVar18 = 0;
        if ((byte)local_50 != '\0') {
          uVar18 = (uint)(byte)local_68;
        }
        local_68 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)CONCAT44(local_68._4_4_,uVar18);
        uVar14 = (ulong)_cStack_38 & 0xffffffff;
        arrayRegOpnd = local_48;
      }
    }
    if (((char)uVar14 != '\0') || ((byte)local_68 != '\0')) {
      _cStack_38 = (Opnd *)CONCAT44(uStack_34,(int)uVar14);
      if ((byte)local_50 == '\0') {
        if (instr == (Instr *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar10 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x1206,"(instr)","instr");
          if (!bVar4) goto LAB_003e87dc;
          *puVar10 = 0;
        }
        paVar12 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)instr;
        pBVar3 = this;
        if (instr->m_opcode == NoImplicitCallUses) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar10 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x1207,"(instr->m_opcode != Js::OpCode::NoImplicitCallUses)",
                             "instr->m_opcode != Js::OpCode::NoImplicitCallUses");
          if (!bVar4) goto LAB_003e87dc;
          *puVar10 = 0;
          pBVar3 = this;
        }
        do {
          local_78 = pBVar3;
          paVar12 = *(anon_union_2_4_ea848c7b_for_ValueType_13 **)(paVar12 + 0xc);
          if (paVar12 == (anon_union_2_4_ea848c7b_for_ValueType_13 *)0x0) {
            uVar14 = (ulong)_cStack_38 & 0xffffffff;
            goto LAB_003e849e;
          }
        } while ((((*(IRKind *)((long)paVar12 + 0x39) != InstrKindLabel) &&
                  (*(IRKind *)((long)paVar12 + 0x39) != InstrKindProfiledLabel)) &&
                 ((bVar4 = IR::Instr::IsRealInstr((Instr *)&paVar12->field_0), !bVar4 ||
                  ((*(IRKind *)((long)paVar12 + 0x39) == InstrKindByteCodeUses &&
                   (paVar12[0x18].bits == (Number|IntCanBeUntagged|Null))))))) &&
                (pBVar3 = local_78, paVar12[0x18].bits != (Number|IntCanBeUntagged|Null|Undefined)))
        ;
        puVar10 = (undefined4 *)__tls_get_addr();
        uVar14 = (ulong)_cStack_38 & 0xffffffff;
        do {
          if (paVar12[0x18].bits != (Number|IntCanBeUntagged|Null|Undefined)) break;
          local_98[0] = *(Opnd **)(paVar12 + 0x24);
          local_98[1] = *(Opnd **)(paVar12 + 0x28);
          lVar20 = 0;
          local_80 = paVar12;
          do {
            pRVar13 = (RegOpnd *)local_98[lVar20];
            if (pRVar13 == (RegOpnd *)0x0) break;
            bVar5 = IR::Opnd::IsEqual((Opnd *)pRVar13,(Opnd *)arrayRegOpnd);
            bVar4 = true;
            if (bVar5) {
              local_52 = (pRVar13->super_Opnd).m_valueType.field_0;
              bVar5 = ValueType::IsLikelyObject((ValueType *)&local_52.field_0);
              if (bVar5) {
                OVar8 = ValueType::GetObjectType((ValueType *)&local_52.field_0);
                OVar9 = ValueType::GetObjectType((ValueType *)&local_3a.field_0);
                arrayRegOpnd = local_48;
                if (OVar8 == OVar9) {
                  OVar6 = IR::Opnd::GetKind((Opnd *)pRVar13);
                  if (OVar6 != OpndKindReg) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar10 = 1;
                    bVar5 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
                    if (!bVar5) goto LAB_003e87dc;
                    *puVar10 = 0;
                    arrayRegOpnd = local_48;
                  }
                  bVar5 = IR::RegOpnd::IsArrayRegOpnd(pRVar13);
                  if (bVar5) {
                    bVar5 = IR::RegOpnd::IsArrayRegOpnd(pRVar13);
                    if (!bVar5) {
                      AssertCount = AssertCount + 1;
                      Js::Throw::LogAssert();
                      *puVar10 = 1;
                      bVar5 = Js::Throw::ReportAssert
                                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                         ,0x24d,"(IsArrayRegOpnd())","IsArrayRegOpnd()");
                      if (!bVar5) goto LAB_003e87dc;
                      *puVar10 = 0;
                      arrayRegOpnd = local_48;
                    }
                    if ((((byte)local_68 == '\0') ||
                        ((StackSym *)pRVar13[1].super_Opnd._vptr_Opnd ==
                         arrayRegOpnd->headSegmentSym)) &&
                       ((cStack_38 == '\0' ||
                        (*(StackSym **)&pRVar13[1].super_Opnd.m_valueType ==
                         arrayRegOpnd->headSegmentLengthSym)))) {
                      bVar4 = false;
                      local_a0 = pRVar13;
                    }
                  }
                }
              }
            }
            if (!bVar4) {
              bVar4 = false;
              goto LAB_003e8360;
            }
            lVar20 = lVar20 + 1;
          } while (lVar20 == 1);
          bVar4 = true;
LAB_003e8360:
          instr = (Instr *)local_60;
          if (!bVar4) {
            uVar14 = (ulong)_cStack_38 & 0xffffffff;
            goto LAB_003e84a0;
          }
          paVar12 = *(anon_union_2_4_ea848c7b_for_ValueType_13 **)(local_80 + 0xc);
          uVar14 = (ulong)_cStack_38 & 0xffffffff;
        } while (paVar12 != (anon_union_2_4_ea848c7b_for_ValueType_13 *)0x0);
LAB_003e849e:
        local_a0 = (RegOpnd *)0x0;
LAB_003e84a0:
        this = local_78;
        if (local_a0 != (RegOpnd *)0x0) {
          OVar6 = IR::Opnd::GetKind(&local_a0->super_Opnd);
          if (OVar6 != OpndKindReg) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar10 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
            if (!bVar4) goto LAB_003e87dc;
            *puVar10 = 0;
          }
          bVar4 = IR::RegOpnd::IsArrayRegOpnd(local_a0);
          if (!bVar4) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar10 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x24d,"(IsArrayRegOpnd())","IsArrayRegOpnd()");
            if (!bVar4) goto LAB_003e87dc;
            *puVar10 = 0;
          }
          goto LAB_003e8772;
        }
LAB_003e8576:
        bVar17 = (byte)uVar14;
        local_a0 = (RegOpnd *)0x0;
      }
      else {
        if ((char)uVar14 == '\0') goto LAB_003e8576;
        pRVar13 = IR::RegOpnd::New(arrayRegOpnd->headSegmentLengthSym,
                                   arrayRegOpnd->headSegmentLengthSym->m_type,instr->m_func);
        if (instr == (Instr *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          paVar12 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)__tls_get_addr(&PTR_0155fe48);
          *(undefined4 *)paVar12 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x1206,"(instr)","instr");
          if (!bVar4) goto LAB_003e87dc;
          *(undefined4 *)paVar12 = 0;
          instr = (Instr *)local_60;
        }
        this_02 = local_60;
        if (((anon_union_2_4_ea848c7b_for_ValueType_13 *)((long)instr + 0x30))->bits ==
            (Number|IntCanBeUntagged|Null|Undefined)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          paVar12 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)__tls_get_addr(&PTR_0155fe48);
          *(undefined4 *)paVar12 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x1207,"(instr->m_opcode != Js::OpCode::NoImplicitCallUses)",
                             "instr->m_opcode != Js::OpCode::NoImplicitCallUses");
          if (!bVar4) goto LAB_003e87dc;
          *(undefined4 *)paVar12 = 0;
          this_02 = local_60;
        }
        do {
          this_02 = *(anon_union_2_4_ea848c7b_for_ValueType_13 **)(this_02 + 0xc);
          if (this_02 == (anon_union_2_4_ea848c7b_for_ValueType_13 *)0x0) {
            paVar12 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)0x0;
            paVar19 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)0x0;
            this = this;
            goto LAB_003e858c;
          }
        } while ((((*(IRKind *)((long)this_02 + 0x39) != InstrKindLabel) &&
                  (*(IRKind *)((long)this_02 + 0x39) != InstrKindProfiledLabel)) &&
                 ((bVar4 = IR::Instr::IsRealInstr((Instr *)&this_02->field_0), !bVar4 ||
                  ((*(IRKind *)((long)this_02 + 0x39) == InstrKindByteCodeUses &&
                   (this_02[0x18].bits == (Number|IntCanBeUntagged|Null))))))) &&
                (this_02[0x18].bits != (Number|IntCanBeUntagged|Null|Undefined)));
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        local_78 = this;
        do {
          if (this_02[0x18].bits != (Number|IntCanBeUntagged|Null|Undefined)) break;
          local_98[0] = *(Opnd **)(this_02 + 0x24);
          local_98[1] = *(Opnd **)(this_02 + 0x28);
          lVar20 = 0;
          local_80 = this_02;
          do {
            paVar19 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)local_98[lVar20];
            if (paVar19 == (anon_union_2_4_ea848c7b_for_ValueType_13 *)0x0) break;
            bVar5 = IR::Opnd::IsEqual((Opnd *)&paVar19->field_0,&pRVar13->super_Opnd);
            bVar4 = true;
            if (bVar5) {
              OVar6 = IR::Opnd::GetKind((Opnd *)&paVar19->field_0);
              if (OVar6 != OpndKindReg) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar10 = 1;
                bVar4 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                   ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
                if (!bVar4) goto LAB_003e87dc;
                *puVar10 = 0;
                this_02 = local_80;
              }
              bVar4 = *(Instr **)(paVar19 + 8) != (Instr *)local_48->headSegmentLengthSym;
              if (!bVar4) {
                bVar4 = false;
                paVar12 = paVar19;
                local_70 = this_02;
              }
            }
            if (!bVar4) {
              bVar4 = false;
              goto LAB_003e8094;
            }
            lVar20 = lVar20 + 1;
          } while (lVar20 == 1);
          bVar4 = true;
LAB_003e8094:
          paVar19 = local_70;
          arrayRegOpnd = local_48;
          this = local_78;
          if (!bVar4) goto LAB_003e858c;
          this_02 = *(anon_union_2_4_ea848c7b_for_ValueType_13 **)(this_02 + 0xc);
        } while (this_02 != (anon_union_2_4_ea848c7b_for_ValueType_13 *)0x0);
        paVar12 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)0x0;
        paVar19 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)0x0;
        this = local_78;
LAB_003e858c:
        IR::RegOpnd::FreeInternal(pRVar13,*(Func **)(local_60 + 0x10));
        instr = (Instr *)local_60;
        local_80 = paVar12;
        if (paVar12 == (anon_union_2_4_ea848c7b_for_ValueType_13 *)0x0) {
          local_a0 = (RegOpnd *)0x0;
        }
        else {
          local_70 = paVar19;
          if (paVar19 == (anon_union_2_4_ea848c7b_for_ValueType_13 *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar10 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                               ,0x12a6,"(noImplicitCallUsesInstr)","noImplicitCallUsesInstr");
            if (!bVar4) goto LAB_003e87dc;
            *puVar10 = 0;
          }
          if (*(Opnd **)(local_70 + 0x20) != (Opnd *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar10 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                               ,0x12a7,"(!noImplicitCallUsesInstr->GetDst())",
                               "!noImplicitCallUsesInstr->GetDst()");
            if (!bVar4) goto LAB_003e87dc;
            *puVar10 = 0;
          }
          if (*(Opnd **)(local_70 + 0x24) == (Opnd *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar10 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                               ,0x12a8,"(noImplicitCallUsesInstr->GetSrc1())",
                               "noImplicitCallUsesInstr->GetSrc1()");
            if (!bVar4) goto LAB_003e87dc;
            *puVar10 = 0;
          }
          paVar12 = local_70;
          if (local_80 == *(anon_union_2_4_ea848c7b_for_ValueType_13 **)(local_70 + 0x24)) {
            if (*(anon_union_2_4_ea848c7b_for_ValueType_13 **)(local_70 + 0x28) ==
                (anon_union_2_4_ea848c7b_for_ValueType_13 *)0x0) {
              IR::Instr::FreeSrc1((Instr *)&local_70->field_0);
              paVar12[0x18].bits = Null|Undefined;
            }
            else {
              pOVar16 = IR::Instr::UnlinkSrc2((Instr *)&local_70->field_0);
              IR::Instr::ReplaceSrc1((Instr *)&paVar12->field_0,pOVar16);
            }
          }
          else {
            if (local_80 != *(anon_union_2_4_ea848c7b_for_ValueType_13 **)(local_70 + 0x28)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
              *puVar10 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                 ,0x12b7,"(use == noImplicitCallUsesInstr->GetSrc2())",
                                 "use == noImplicitCallUsesInstr->GetSrc2()");
              if (!bVar4) goto LAB_003e87dc;
              *puVar10 = 0;
            }
            IR::Instr::FreeSrc2((Instr *)&local_70->field_0);
          }
          local_a0 = (RegOpnd *)0x0;
        }
LAB_003e8772:
        bVar17 = (byte)_cStack_38;
      }
      if (((byte)local_68 != '\0') &&
         (((byte)local_50 != '\0' ||
          (bVar17 = (byte)_cStack_38,
          (~bVar17 & arrayRegOpnd->headSegmentLengthSym != (StackSym *)0x0) == 0)))) {
        arrayRegOpnd->headSegmentSym = (StackSym *)0x0;
        *(undefined1 *)((long)instr + 0x37) = *(undefined1 *)((long)instr + 0x37) & 0xfb;
        if (local_a0 != (RegOpnd *)0x0) {
          local_a0[1].super_Opnd._vptr_Opnd = (_func_int **)0x0;
        }
      }
      if (bVar17 != 0) {
        arrayRegOpnd->headSegmentLengthSym = (StackSym *)0x0;
        *(undefined1 *)((long)instr + 0x37) = *(undefined1 *)((long)instr + 0x37) & 0xf7;
        if (local_a0 != (RegOpnd *)0x0) {
          local_a0[1].super_Opnd.m_valueType = (anon_union_2_4_ea848c7b_for_ValueType_13)0x0;
          local_a0[1].super_Opnd.m_type = TyIllegal;
          local_a0[1].super_Opnd.field_0xb = 0;
          local_a0[1].super_Opnd.m_kind = OpndKindInvalid;
          local_a0[1].super_Opnd.isDeleted = false;
          *(undefined2 *)&local_a0[1].super_Opnd.field_0xe = 0;
        }
      }
    }
  }
  if (((byte)local_50 == '\0') &&
     (((anon_union_2_4_ea848c7b_for_ValueType_13 *)((long)instr + 0x30))->bits !=
      (Number|IntCanBeUntagged|Null|Undefined))) {
    return;
  }
  if (arrayRegOpnd->headSegmentSym != (StackSym *)0x0) {
    ProcessStackSymUse(this,arrayRegOpnd->headSegmentSym,'\x01');
    pBVar2 = local_88;
    if ((byte)local_50 == '\0') {
      BVSparse<Memory::JitArenaAllocator>::Set
                (local_88->noImplicitCallUses,(arrayRegOpnd->headSegmentSym->super_Sym).m_id);
      BVSparse<Memory::JitArenaAllocator>::Set
                (pBVar2->noImplicitCallJsArrayHeadSegmentSymUses,
                 (arrayRegOpnd->headSegmentSym->super_Sym).m_id);
    }
  }
  pSVar11 = arrayRegOpnd->headSegmentLengthSym;
  if (pSVar11 != (StackSym *)0x0) {
    if ((byte)local_50 == '\0') {
      ProcessStackSymUse(this,pSVar11,'\x01');
      pBVar2 = local_88;
      BVSparse<Memory::JitArenaAllocator>::Set
                (local_88->noImplicitCallUses,(arrayRegOpnd->headSegmentLengthSym->super_Sym).m_id);
      this_01 = pBVar2->noImplicitCallJsArrayHeadSegmentSymUses;
    }
    else {
      local_78 = this;
      pRVar13 = IR::RegOpnd::New(pSVar11,pSVar11->m_type,*(Func **)((long)instr + 0x20));
      if ((anon_union_2_4_ea848c7b_for_ValueType_13 *)instr ==
          (anon_union_2_4_ea848c7b_for_ValueType_13 *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x1206,"(instr)","instr");
        if (!bVar4) goto LAB_003e87dc;
        *puVar10 = 0;
      }
      paVar12 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)instr;
      if (((anon_union_2_4_ea848c7b_for_ValueType_13 *)((long)instr + 0x30))->bits ==
          (Number|IntCanBeUntagged|Null|Undefined)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x1207,"(instr->m_opcode != Js::OpCode::NoImplicitCallUses)",
                           "instr->m_opcode != Js::OpCode::NoImplicitCallUses");
        if (!bVar4) goto LAB_003e87dc;
        *puVar10 = 0;
      }
      do {
        paVar12 = *(anon_union_2_4_ea848c7b_for_ValueType_13 **)(paVar12 + 0xc);
        if (paVar12 == (anon_union_2_4_ea848c7b_for_ValueType_13 *)0x0) {
          IR::RegOpnd::FreeInternal(pRVar13,*(Func **)((long)instr + 0x20));
          this = local_78;
          goto LAB_003e83b9;
        }
      } while ((((*(IRKind *)((long)paVar12 + 0x39) != InstrKindLabel) &&
                (*(IRKind *)((long)paVar12 + 0x39) != InstrKindProfiledLabel)) &&
               ((bVar4 = IR::Instr::IsRealInstr((Instr *)&paVar12->field_0), !bVar4 ||
                ((*(IRKind *)((long)paVar12 + 0x39) == InstrKindByteCodeUses &&
                 (paVar12[0x18].bits == (Number|IntCanBeUntagged|Null))))))) &&
              (paVar12[0x18].bits != (Number|IntCanBeUntagged|Null|Undefined)));
      local_50 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      do {
        if (paVar12[0x18].bits != (Number|IntCanBeUntagged|Null|Undefined)) break;
        local_98[0] = *(Opnd **)(paVar12 + 0x24);
        local_98[1] = *(Opnd **)(paVar12 + 0x28);
        lVar20 = 0;
        local_68 = paVar12;
        do {
          pOVar16 = local_98[lVar20];
          bVar4 = true;
          if (pOVar16 == (Opnd *)0x0) break;
          bVar5 = IR::Opnd::IsEqual(pOVar16,&pRVar13->super_Opnd);
          if (bVar5) {
            OVar6 = IR::Opnd::GetKind(pOVar16);
            if (OVar6 != OpndKindReg) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar10 = local_50;
              *local_50 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                 ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
              if (!bVar5) goto LAB_003e87dc;
              *puVar10 = 0;
            }
            if ((StackSym *)pOVar16[1]._vptr_Opnd != local_48->headSegmentLengthSym)
            goto LAB_003e7b18;
            bVar5 = false;
            _cStack_38 = pOVar16;
          }
          else {
LAB_003e7b18:
            bVar5 = true;
          }
          if (!bVar5) {
            bVar4 = false;
            break;
          }
          lVar20 = lVar20 + 1;
        } while (lVar20 == 1);
        pOVar16 = _cStack_38;
        instr = (Instr *)local_60;
        arrayRegOpnd = local_48;
        if (!bVar4) goto LAB_003e8391;
        paVar12 = *(anon_union_2_4_ea848c7b_for_ValueType_13 **)(local_68 + 0xc);
      } while (paVar12 != (anon_union_2_4_ea848c7b_for_ValueType_13 *)0x0);
      pOVar16 = (Opnd *)0x0;
LAB_003e8391:
      IR::RegOpnd::FreeInternal(pRVar13,*(Func **)((long)instr + 0x20));
      this = local_78;
      if (pOVar16 == (Opnd *)0x0) goto LAB_003e83b9;
      this_01 = local_78->considerSymsAsRealUsesInNoImplicitCallUses;
    }
    BVSparse<Memory::JitArenaAllocator>::Set
              (this_01,(arrayRegOpnd->headSegmentLengthSym->super_Sym).m_id);
  }
LAB_003e83b9:
  pSVar11 = IR::ArrayRegOpnd::LengthSym(arrayRegOpnd);
  if ((pSVar11 != (StackSym *)0x0) && (pSVar11 != arrayRegOpnd->headSegmentLengthSym)) {
    ProcessStackSymUse(this,pSVar11,'\x01');
    bVar4 = ValueType::IsArray((ValueType *)&local_3a.field_0);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x1306,"(arrayValueType.IsArray())","arrayValueType.IsArray()");
      if (!bVar4) {
LAB_003e87dc:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar10 = 0;
    }
    pBVar2 = local_88;
    BVSparse<Memory::JitArenaAllocator>::Set(local_88->noImplicitCallUses,(pSVar11->super_Sym).m_id)
    ;
    BVSparse<Memory::JitArenaAllocator>::Set
              (pBVar2->noImplicitCallArrayLengthSymUses,(pSVar11->super_Sym).m_id);
  }
  return;
}

Assistant:

void
BackwardPass::ProcessArrayRegOpndUse(IR::Instr *const instr, IR::ArrayRegOpnd *const arrayRegOpnd)
{
    Assert(tag == Js::DeadStorePhase);
    Assert(!IsCollectionPass());
    Assert(instr);
    Assert(arrayRegOpnd);

    if(!(arrayRegOpnd->HeadSegmentSym() || arrayRegOpnd->HeadSegmentLengthSym() || arrayRegOpnd->LengthSym()))
    {
        return;
    }

    const ValueType arrayValueType(arrayRegOpnd->GetValueType());
    const bool isJsArray = !arrayValueType.IsLikelyTypedArray();
    Assert(isJsArray == arrayValueType.IsArrayOrObjectWithArray());
    Assert(!isJsArray == arrayValueType.IsOptimizedTypedArray());

    BasicBlock *const block = currentBlock;
    if(!IsPrePass() &&
        (arrayRegOpnd->HeadSegmentSym() || arrayRegOpnd->HeadSegmentLengthSym()) &&
        (!isJsArray || instr->m_opcode != Js::OpCode::NoImplicitCallUses))
    {
        bool headSegmentIsLoadedButUnused =
            instr->loadedArrayHeadSegment &&
            arrayRegOpnd->HeadSegmentSym() &&
            !block->upwardExposedUses->Test(arrayRegOpnd->HeadSegmentSym()->m_id);
        const bool headSegmentLengthIsLoadedButUnused =
            instr->loadedArrayHeadSegmentLength &&
            arrayRegOpnd->HeadSegmentLengthSym() &&
            !block->upwardExposedUses->Test(arrayRegOpnd->HeadSegmentLengthSym()->m_id);
        if(headSegmentLengthIsLoadedButUnused && instr->extractedUpperBoundCheckWithoutHoisting)
        {
            // Find the upper bound check (index[src1] <= headSegmentLength[src2] + offset[dst])
            IR::Instr *upperBoundCheck = this->globOpt->FindUpperBoundsCheckInstr(instr);
            Assert(upperBoundCheck && upperBoundCheck != instr);
            Assert(upperBoundCheck->GetSrc2()->AsRegOpnd()->m_sym == arrayRegOpnd->HeadSegmentLengthSym());

            // Find the head segment length load
            IR::Instr *headSegmentLengthLoad = this->globOpt->FindArraySegmentLoadInstr(upperBoundCheck);

            Assert(headSegmentLengthLoad->GetDst()->AsRegOpnd()->m_sym == arrayRegOpnd->HeadSegmentLengthSym());
            Assert(
                headSegmentLengthLoad->GetSrc1()->AsIndirOpnd()->GetBaseOpnd()->m_sym ==
                (isJsArray ? arrayRegOpnd->HeadSegmentSym() : arrayRegOpnd->m_sym));

            // Fold the head segment length load into the upper bound check. Keep the load instruction there with a Nop so that
            // the head segment length sym can be marked as unused before the Nop. The lowerer will remove it.
            upperBoundCheck->ReplaceSrc2(headSegmentLengthLoad->UnlinkSrc1());
            headSegmentLengthLoad->m_opcode = Js::OpCode::Nop;

            if(isJsArray)
            {
                // The head segment length is on the head segment, so the bound check now uses the head segment sym
                headSegmentIsLoadedButUnused = false;
            }
        }

        if(headSegmentIsLoadedButUnused || headSegmentLengthIsLoadedButUnused)
        {
            // Check if the head segment / head segment length are being loaded here. If so, remove them and let the fast
            // path load them since it does a better job.
            IR::ArrayRegOpnd *noImplicitCallArrayUse = nullptr;
            if(isJsArray)
            {
                IR::Opnd *const use =
                    FindNoImplicitCallUse(
                        instr,
                        arrayRegOpnd,
                        [&](IR::Opnd *const checkedSrc) -> bool
                        {
                            const ValueType checkedSrcValueType(checkedSrc->GetValueType());
                            if(!checkedSrcValueType.IsLikelyObject() ||
                                checkedSrcValueType.GetObjectType() != arrayValueType.GetObjectType())
                            {
                                return false;
                            }

                            IR::RegOpnd *const checkedRegSrc = checkedSrc->AsRegOpnd();
                            if(!checkedRegSrc->IsArrayRegOpnd())
                            {
                                return false;
                            }

                            IR::ArrayRegOpnd *const checkedArraySrc = checkedRegSrc->AsArrayRegOpnd();
                            if(headSegmentIsLoadedButUnused &&
                                checkedArraySrc->HeadSegmentSym() != arrayRegOpnd->HeadSegmentSym())
                            {
                                return false;
                            }
                            if(headSegmentLengthIsLoadedButUnused &&
                                checkedArraySrc->HeadSegmentLengthSym() != arrayRegOpnd->HeadSegmentLengthSym())
                            {
                                return false;
                            }
                            return true;
                        });
                if(use)
                {
                    noImplicitCallArrayUse = use->AsRegOpnd()->AsArrayRegOpnd();
                }
            }
            else if(headSegmentLengthIsLoadedButUnused)
            {
                // A typed array's head segment length may be zeroed when the typed array's buffer is transferred to a web
                // worker, so the head segment length sym use is included in a NoImplicitCallUses instruction. Since there
                // are no forward uses of the head segment length sym, to allow removing the extracted head segment length
                // load, the corresponding head segment length sym use in the NoImplicitCallUses instruction must also be
                // removed.
                IR::Instr *noImplicitCallUsesInstr;
                IR::Opnd *const use =
                    FindNoImplicitCallUse(
                        instr,
                        arrayRegOpnd->HeadSegmentLengthSym(),
                        [&](IR::Opnd *const checkedSrc) -> bool
                        {
                            return checkedSrc->AsRegOpnd()->m_sym == arrayRegOpnd->HeadSegmentLengthSym();
                        },
                        &noImplicitCallUsesInstr);
                if(use)
                {
                    Assert(noImplicitCallUsesInstr);
                    Assert(!noImplicitCallUsesInstr->GetDst());
                    Assert(noImplicitCallUsesInstr->GetSrc1());
                    if(use == noImplicitCallUsesInstr->GetSrc1())
                    {
                        if(noImplicitCallUsesInstr->GetSrc2())
                        {
                            noImplicitCallUsesInstr->ReplaceSrc1(noImplicitCallUsesInstr->UnlinkSrc2());
                        }
                        else
                        {
                            noImplicitCallUsesInstr->FreeSrc1();
                            noImplicitCallUsesInstr->m_opcode = Js::OpCode::Nop;
                        }
                    }
                    else
                    {
                        Assert(use == noImplicitCallUsesInstr->GetSrc2());
                        noImplicitCallUsesInstr->FreeSrc2();
                    }
                }
            }

            if(headSegmentIsLoadedButUnused &&
                (!isJsArray || !arrayRegOpnd->HeadSegmentLengthSym() || headSegmentLengthIsLoadedButUnused))
            {
                // For JS arrays, the head segment length load is dependent on the head segment. So, only remove the head
                // segment load if the head segment length load can also be removed.
                arrayRegOpnd->RemoveHeadSegmentSym();
                instr->loadedArrayHeadSegment = false;
                if(noImplicitCallArrayUse)
                {
                    noImplicitCallArrayUse->RemoveHeadSegmentSym();
                }
            }
            if(headSegmentLengthIsLoadedButUnused)
            {
                arrayRegOpnd->RemoveHeadSegmentLengthSym();
                instr->loadedArrayHeadSegmentLength = false;
                if(noImplicitCallArrayUse)
                {
                    noImplicitCallArrayUse->RemoveHeadSegmentLengthSym();
                }
            }
        }
    }

    if(isJsArray && instr->m_opcode != Js::OpCode::NoImplicitCallUses)
    {
        // Only uses in NoImplicitCallUses instructions are counted toward liveness
        return;
    }

    // Treat dependent syms as uses. For JS arrays, only uses in NoImplicitCallUses count because only then the assumptions made
    // on the dependent syms are guaranteed to be valid. Similarly for typed arrays, a head segment length sym use counts toward
    // liveness only in a NoImplicitCallUses instruction.
    if(arrayRegOpnd->HeadSegmentSym())
    {
        ProcessStackSymUse(arrayRegOpnd->HeadSegmentSym(), true);
        if(isJsArray)
        {
            block->noImplicitCallUses->Set(arrayRegOpnd->HeadSegmentSym()->m_id);
            block->noImplicitCallJsArrayHeadSegmentSymUses->Set(arrayRegOpnd->HeadSegmentSym()->m_id);
        }
    }
    if(arrayRegOpnd->HeadSegmentLengthSym())
    {
        if(isJsArray)
        {
            ProcessStackSymUse(arrayRegOpnd->HeadSegmentLengthSym(), true);
            block->noImplicitCallUses->Set(arrayRegOpnd->HeadSegmentLengthSym()->m_id);
            block->noImplicitCallJsArrayHeadSegmentSymUses->Set(arrayRegOpnd->HeadSegmentLengthSym()->m_id);
        }
        else
        {
            // ProcessNoImplicitCallUses automatically marks JS array reg opnds and their corresponding syms as live. A typed
            // array's head segment length sym also needs to be marked as live at its use in the NoImplicitCallUses instruction,
            // but it is just in a reg opnd. Flag the opnd to have the sym be marked as live when that instruction is processed.
            IR::Opnd *const use =
                FindNoImplicitCallUse(
                    instr,
                    arrayRegOpnd->HeadSegmentLengthSym(),
                    [&](IR::Opnd *const checkedSrc) -> bool
                    {
                        return checkedSrc->AsRegOpnd()->m_sym == arrayRegOpnd->HeadSegmentLengthSym();
                    });
            if(use)
            {
                considerSymsAsRealUsesInNoImplicitCallUses->Set(arrayRegOpnd->HeadSegmentLengthSym()->m_id);
            }
        }
    }
    StackSym *const lengthSym = arrayRegOpnd->LengthSym();
    if(lengthSym && lengthSym != arrayRegOpnd->HeadSegmentLengthSym())
    {
        ProcessStackSymUse(lengthSym, true);
        Assert(arrayValueType.IsArray());
        block->noImplicitCallUses->Set(lengthSym->m_id);
        block->noImplicitCallArrayLengthSymUses->Set(lengthSym->m_id);
    }
}